

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu.c
# Opt level: O0

RK_U32 VPUCheckSupportWidth(void)

{
  RK_S32 RVar1;
  int local_5c;
  RK_U32 local_58;
  int fd;
  VPUHwDecConfig_t hwCfg;
  
  local_5c = open("/dev/vpu_service",0x80002);
  if (local_5c < 0) {
    local_5c = open("/dev/vpu-service",0x80002);
  }
  memset(&local_58,0,0x4c);
  if (-1 < local_5c) {
    RVar1 = VPUClientGetHwCfg(local_5c,&local_58,0x4c);
    if (RVar1 != 0) {
      _mpp_log_l(2,"vpu","Get HwCfg failed\n","VPUCheckSupportWidth");
      close(local_5c);
      return 0xffffffff;
    }
    close(local_5c);
  }
  return local_58;
}

Assistant:

RK_U32 VPUCheckSupportWidth()
{
    VPUHwDecConfig_t hwCfg;
    int fd = -1;
    fd = open("/dev/vpu_service", O_RDWR | O_CLOEXEC);
    if (fd < 0) {
        fd = open("/dev/vpu-service", O_RDWR | O_CLOEXEC);
    }
    memset(&hwCfg, 0, sizeof(VPUHwDecConfig_t));
    if (fd >= 0) {
        if (VPUClientGetHwCfg(fd, (RK_U32*)&hwCfg, sizeof(hwCfg))) {
            mpp_err_f("Get HwCfg failed\n");
            close(fd);
            return -1;
        }
        close(fd);
        fd = -1;
    }
    return hwCfg.maxDecPicWidth;
}